

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

Value __thiscall
MiniScript::Parser::ParseSeqLookup(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  int iVar1;
  ParseState *pPVar2;
  undefined4 uVar3;
  Type TVar4;
  undefined7 in_register_00000011;
  Lexer *other;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  byte in_R8B;
  Value VVar5;
  String local_3e0;
  Lexer local_3d0;
  Token local_3c8;
  Value local_3a8;
  Value local_398;
  Value local_388;
  TACLine local_378;
  undefined1 local_318 [8];
  Value temp_3;
  Value local_2f8;
  Value local_2e8;
  Value local_2d8;
  TACLine local_2c8;
  undefined1 local_268 [8];
  Value temp_2;
  SeqElemStorage *vsVal;
  Value local_240;
  Value local_230;
  List<MiniScript::TACLine> local_220;
  undefined1 local_210 [8];
  Value temp_1;
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [8];
  Value index2_1;
  Token local_198;
  Lexer local_178;
  undefined1 local_170 [8];
  Value index;
  List<MiniScript::TACLine> local_130;
  undefined1 local_120 [8];
  Value temp;
  undefined1 local_108 [8];
  Value index2;
  Type local_d8;
  Value local_b8;
  undefined1 local_a8 [48];
  Token local_78;
  Lexer local_48;
  undefined1 local_39;
  code *local_38;
  offset_in_Parser_to_subr nextLevel;
  byte local_22;
  byte local_21;
  bool statementStart_local;
  Lexer *pLStack_20;
  bool asLval_local;
  Lexer *tokens_local;
  Parser *this_local;
  Value *val;
  
  other = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_22 = in_R8B & 1;
  local_38 = ParseMap;
  nextLevel = 0;
  local_39 = 0;
  local_21 = statementStart;
  pLStack_20 = other;
  tokens_local = tokens;
  this_local = this;
  Lexer::Lexer(&local_48,other);
  ParseMap(this,tokens,SUB81(&local_48,0),(bool)(local_21 & 1));
  Lexer::~Lexer(&local_48);
  while( true ) {
    Lexer::Peek(&local_78,other);
    TVar4 = local_78.type;
    Token::~Token(&local_78);
    if (TVar4 != LSquare) break;
    Lexer::Dequeue((Token *)(local_a8 + 0x10),other);
    Token::~Token((Token *)(local_a8 + 0x10));
    Value::Value(&local_b8,(Value *)this);
    FullyEvaluate((Parser *)local_a8,(Value *)tokens,(LocalOnlyMode)&local_b8);
    Value::operator=((Value *)this,(Value *)local_a8);
    Value::~Value((Value *)local_a8);
    Value::~Value(&local_b8);
    Lexer::Peek((Token *)&stack0xffffffffffffff28,other);
    TVar4 = local_d8;
    Token::~Token((Token *)&stack0xffffffffffffff28);
    if (TVar4 == Colon) {
      Lexer::Dequeue((Token *)&index2.data,other);
      Token::~Token((Token *)&index2.data);
      Lexer::Lexer((Lexer *)&temp.data,other);
      ParseExpr((Parser *)local_108,tokens,(bool)((char)&temp + '\b'),false);
      Lexer::~Lexer((Lexer *)&temp.data);
      iVar1 = *(int *)&((tokens[6].ls)->pending).ls;
      *(int *)&((tokens[6].ls)->pending).ls = iVar1 + 1;
      Value::Temp((Value *)local_120,iVar1);
      List<MiniScript::TACLine>::List(&local_130,(List<MiniScript::TACLine> *)tokens[6].ls);
      Value::Value((Value *)&stack0xfffffffffffffec0,(Value *)this);
      Value::Value((Value *)&stack0xfffffffffffffeb0,(Value *)Value::null);
      Value::Value((Value *)&index.data,(Value *)local_108);
      Intrinsics::CompileSlice
                (&local_130,(Value *)&stack0xfffffffffffffec0,(Value *)&stack0xfffffffffffffeb0,
                 (Value *)&index.data,temp._0_4_);
      Value::~Value((Value *)&index.data);
      Value::~Value((Value *)&stack0xfffffffffffffeb0);
      Value::~Value((Value *)&stack0xfffffffffffffec0);
      List<MiniScript::TACLine>::~List(&local_130);
      Value::operator=((Value *)this,(Value *)local_120);
      Value::~Value((Value *)local_120);
      Value::~Value((Value *)local_108);
    }
    else {
      Lexer::Lexer(&local_178,other);
      ParseExpr((Parser *)local_170,tokens,SUB81(&local_178,0),false);
      Lexer::~Lexer(&local_178);
      Lexer::Peek(&local_198,other);
      TVar4 = local_198.type;
      Token::~Token(&local_198);
      if (TVar4 == Colon) {
        Lexer::Dequeue((Token *)&index2_1.data,other);
        Token::~Token((Token *)&index2_1.data);
        Value::Value((Value *)local_1c8,(Value *)Value::null);
        Lexer::Peek((Token *)(local_1f8 + 0x10),other);
        uVar3 = local_1f8._16_4_;
        Token::~Token((Token *)(local_1f8 + 0x10));
        if (uVar3 != 0x1b) {
          Lexer::Lexer((Lexer *)&temp_1.data,other);
          ParseExpr((Parser *)local_1f8,tokens,false,false);
          Value::operator=((Value *)local_1c8,(Value *)local_1f8);
          Value::~Value((Value *)local_1f8);
          Lexer::~Lexer((Lexer *)&temp_1.data);
        }
        iVar1 = *(int *)&((tokens[6].ls)->pending).ls;
        *(int *)&((tokens[6].ls)->pending).ls = iVar1 + 1;
        Value::Temp((Value *)local_210,iVar1);
        List<MiniScript::TACLine>::List(&local_220,(List<MiniScript::TACLine> *)tokens[6].ls);
        Value::Value(&local_230,(Value *)this);
        Value::Value(&local_240,(Value *)local_170);
        Value::Value((Value *)&vsVal,(Value *)local_1c8);
        Intrinsics::CompileSlice(&local_220,&local_230,&local_240,(Value *)&vsVal,temp_1._0_4_);
        Value::~Value((Value *)&vsVal);
        Value::~Value(&local_240);
        Value::~Value(&local_230);
        List<MiniScript::TACLine>::~List(&local_220);
        Value::operator=((Value *)this,(Value *)local_210);
        Value::~Value((Value *)local_210);
        Value::~Value((Value *)local_1c8);
      }
      else if ((local_22 & 1) == 0) {
        iVar1 = *(int *)&((tokens[6].ls)->pending).ls;
        *(int *)&((tokens[6].ls)->pending).ls = iVar1 + 1;
        Value::Temp((Value *)local_318,iVar1);
        pPVar2 = (ParseState *)tokens[6].ls;
        Value::Value(&local_388,(Value *)local_318);
        Value::Value(&local_398,(Value *)this);
        Value::Value(&local_3a8,(Value *)local_170);
        TACLine::TACLine(&local_378,&local_388,ElemBofA,&local_398,&local_3a8);
        ParseState::Add(pPVar2,&local_378);
        TACLine::~TACLine(&local_378);
        Value::~Value(&local_3a8);
        Value::~Value(&local_398);
        Value::~Value(&local_388);
        Value::operator=((Value *)this,(Value *)local_318);
        Value::~Value((Value *)local_318);
      }
      else {
        if (*(char *)&(this->errorContext).ss == '\b') {
          temp_2.data = *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
          iVar1 = *(int *)&((tokens[6].ls)->pending).ls;
          *(int *)&((tokens[6].ls)->pending).ls = iVar1 + 1;
          Value::Temp((Value *)local_268,iVar1);
          pPVar2 = (ParseState *)tokens[6].ls;
          Value::Value(&local_2d8,(Value *)local_268);
          Value::Value(&local_2e8,(Value *)(temp_2.data.ref + 1));
          Value::Value(&local_2f8,(Value *)(temp_2.data.ref + 2));
          TACLine::TACLine(&local_2c8,&local_2d8,ElemBofA,&local_2e8,&local_2f8);
          ParseState::Add(pPVar2,&local_2c8);
          TACLine::~TACLine(&local_2c8);
          Value::~Value(&local_2f8);
          Value::~Value(&local_2e8);
          Value::~Value(&local_2d8);
          Value::operator=((Value *)this,(Value *)local_268);
          Value::~Value((Value *)local_268);
        }
        Value::SeqElem((Value *)&temp_3.data,(Value *)this,(Value *)local_170);
        Value::operator=((Value *)this,(Value *)&temp_3.data);
        Value::~Value((Value *)&temp_3.data);
      }
      Value::~Value((Value *)local_170);
    }
    Lexer::Lexer(&local_3d0,other);
    String::String(&local_3e0);
    RequireToken(&local_3c8,(Parser *)tokens,&local_3d0,RSquare,&local_3e0);
    Token::~Token(&local_3c8);
    String::~String(&local_3e0);
    Lexer::~Lexer(&local_3d0);
  }
  VVar5.data.number = extraout_RDX.number;
  VVar5._0_8_ = this;
  return VVar5;
}

Assistant:

Value Parser::ParseSeqLookup(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMap;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);

		while (tokens.Peek().type == Token::Type::LSquare) {
			tokens.Dequeue();	// discard '['
			val = FullyEvaluate(val);

			if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[:4]
				tokens.Dequeue();	// discard ':'
				Value index2 = ParseExpr(tokens);
				Value temp = Value::Temp(output->nextTempNum++);
				Intrinsics::CompileSlice(output->code, val, Value::null, index2, temp.data.tempNum);
				val = temp;
			} else {
				Value index = ParseExpr(tokens);
				if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[2:4] or foo[2:]
					tokens.Dequeue();	// discard ':'
					Value index2 = Value::null;
					if (tokens.Peek().type != Token::Type::RSquare) index2 = ParseExpr(tokens);
					Value temp = Value::Temp(output->nextTempNum++);
					Intrinsics::CompileSlice(output->code, val, index, index2, temp.data.tempNum);
					val = temp;
				} else {			// e.g., foo[3]  (not a slice at all)
					if (statementStart) {
						// At the start of a statement, we don't want to compile the
						// last sequence lookup, because we might have to convert it into
						// an assignment.  But we want to compile any previous one.
						if (val.type == ValueType::SeqElem) {
							SeqElemStorage *vsVal = (SeqElemStorage*)val.data.ref;
							Value temp = Value::Temp(output->nextTempNum++);
							output->Add(TACLine(temp, TACLine::Op::ElemBofA, vsVal->sequence, vsVal->index));
							val = temp;
						}
						val = Value::SeqElem(val, index);
					} else {
						// Anywhere else in an expression, we can compile the lookup right away.
						Value temp = Value::Temp(output->nextTempNum++);
						output->Add(TACLine(temp, TACLine::Op::ElemBofA, val, index));
						val = temp;
					}
				}
			}

			RequireToken(tokens, Token::Type::RSquare);
		}
		return val;
	}